

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O3

void __thiscall
burst::k_ary_search_set<int,std::greater<void>>::
initialize<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (k_ary_search_set<int,std::greater<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *range)

{
  int iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  long lVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  const_iterator __cbeg;
  value_container_type buffer;
  int *local_40;
  int *local_38;
  long local_30;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_28;
  
  __first._M_current =
       (range->
       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
       ).
       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin._M_current;
  __last._M_current =
       (range->
       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
       ).
       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End._M_current;
  _Var3._M_current = __first._M_current;
  if (__first._M_current == __last._M_current) {
LAB_001ad109:
    initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
              (this,range);
    return;
  }
  do {
    piVar6 = _Var3._M_current + 1;
    if (piVar6 == __last._M_current) goto LAB_001ad109;
    iVar7 = *_Var3._M_current;
    _Var3._M_current = piVar6;
  } while (*piVar6 < iVar7);
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&local_40,__first,__last,(allocator_type *)&local_28
            );
  piVar5 = local_38;
  piVar6 = local_40;
  if (local_40 != local_38) {
    uVar4 = (long)local_38 - (long)local_40 >> 2;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (local_40,local_38,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (piVar6,piVar5);
  }
  if (local_40 != local_38) {
    piVar6 = local_40 + 1;
    do {
      piVar5 = piVar6;
      if (piVar5 == local_38) goto LAB_001ad12e;
      iVar7 = piVar5[-1];
      piVar6 = piVar5 + 1;
    } while (*piVar5 < iVar7);
    piVar5 = piVar5 + -1;
    for (; piVar6 != local_38; piVar6 = piVar6 + 1) {
      iVar1 = *piVar6;
      if (iVar1 < iVar7) {
        piVar5[1] = iVar1;
        piVar5 = piVar5 + 1;
        iVar7 = iVar1;
      }
    }
    if (piVar5 + 1 != local_38) {
      local_38 = piVar5 + 1;
    }
  }
LAB_001ad12e:
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_40;
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_38;
  initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (this,&local_28);
  if (local_40 != (int *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }